

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall
S2Builder::EdgeChainSimplifier::SimplifyChain(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  iterator iVar1;
  VertexId *pVVar2;
  pointer piVar3;
  int v0_00;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  S2PolylineSimplifier simplifier;
  int local_98;
  int local_94;
  vector<int,std::allocator<int>> *local_90;
  S2PolylineSimplifier local_88;
  
  local_90 = (vector<int,std::allocator<int>> *)&this->tmp_vertices_;
  local_88.y_dir_.c_[0] = 0.0;
  local_88.y_dir_.c_[1] = 0.0;
  local_88.x_dir_.c_[1] = 0.0;
  local_88.x_dir_.c_[2] = 0.0;
  local_88.src_.c_[2] = 0.0;
  local_88.x_dir_.c_[0] = 0.0;
  local_88.src_.c_[0] = 0.0;
  local_88.src_.c_[1] = 0.0;
  local_88.y_dir_.c_[2] = 0.0;
  local_88.window_.bounds_.c_[0] = 3.141592653589793;
  local_88.window_.bounds_.c_[1] = -3.141592653589793;
  local_98 = v0;
  local_94 = v1;
  do {
    S2PolylineSimplifier::Init
              (&local_88,
               (this->g_->vertices_->
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
               super__Vector_impl_data._M_start + local_98);
    AvoidSites(this,local_98,local_98,local_94,&local_88);
    iVar1._M_current =
         (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_90,iVar1,&local_98);
    }
    else {
      *iVar1._M_current = local_98;
      (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    do {
      iVar1._M_current =
           (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_90,iVar1,&local_94);
      }
      else {
        *iVar1._M_current = local_94;
        (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      v0_00 = local_98;
      uVar6 = (ulong)local_94;
      uVar5 = uVar6 + 0x3f;
      if (-1 < (long)uVar6) {
        uVar5 = uVar6;
      }
      bVar7 = ((this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar5 >> 6) +
                (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar6 & 0x3f) & 1) == 0;
      bVar8 = local_94 == v0;
      if (bVar8 || bVar7) break;
      local_98 = local_94;
      local_94 = FollowChain(this,v0_00,local_94);
      bVar4 = TargetInputVertices(this,local_98,&local_88);
      if (!bVar4) break;
      bVar4 = AvoidSites(this,*(this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start,local_98,local_94,&local_88)
      ;
      if (!bVar4) break;
      bVar4 = S2PolylineSimplifier::Extend
                        (&local_88,
                         (this->g_->vertices_->
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                         _M_impl.super__Vector_impl_data._M_start + local_94);
    } while (bVar4);
    pVVar2 = (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pVVar2 == 8) {
      OutputAllEdges(this,*pVVar2,pVVar2[1]);
    }
    else {
      MergeChain(this,(vector<int,_std::allocator<int>_> *)local_90);
    }
    piVar3 = (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar3) {
      (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar3;
    }
    if (bVar8 || bVar7) {
      return;
    }
  } while( true );
}

Assistant:

void S2Builder::EdgeChainSimplifier::SimplifyChain(VertexId v0, VertexId v1) {
  // Avoid allocating "chain" each time by reusing it.
  vector<VertexId>& chain = tmp_vertices_;
  S2PolylineSimplifier simplifier;
  VertexId vstart = v0;
  bool done = false;
  do {
    // Simplify a subchain of edges starting (v0, v1).
    simplifier.Init(g_.vertex(v0));
    AvoidSites(v0, v0, v1, &simplifier);
    chain.push_back(v0);
    do {
      chain.push_back(v1);
      done = !is_interior_[v1] || v1 == vstart;
      if (done) break;

      // Attempt to extend the chain to the next vertex.
      VertexId vprev = v0;
      v0 = v1;
      v1 = FollowChain(vprev, v0);
    } while (TargetInputVertices(v0, &simplifier) &&
             AvoidSites(chain[0], v0, v1, &simplifier) &&
             simplifier.Extend(g_.vertex(v1)));

    if (chain.size() == 2) {
      OutputAllEdges(chain[0], chain[1]);  // Could not simplify.
    } else {
      MergeChain(chain);
    }
    // Note that any degenerate edges that were not merged into a chain are
    // output by EdgeChainSimplifier::Run().
    chain.clear();
  } while (!done);
}